

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<vector3_base<int>,_allocator_default<vector3_base<int>_>_>::alloc
          (array<vector3_base<int>,_allocator_default<vector3_base<int>_>_> *this,int new_len)

{
  undefined8 uVar1;
  vector3_base<int> *pvVar2;
  vector3_base<int> *pvVar3;
  undefined8 *puVar4;
  undefined4 in_ESI;
  long *in_RDI;
  int unaff_retaddr;
  int i;
  int end;
  vector3_base<int> *new_list;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar5;
  int iVar6;
  int local_20;
  
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  pvVar2 = allocator_default<vector3_base<int>_>::alloc_array(unaff_retaddr);
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    iVar6 = *(int *)((long)in_RDI + 0xc);
  }
  else {
    iVar6 = (int)in_RDI[1];
  }
  for (local_20 = 0; local_20 < iVar6; local_20 = local_20 + 1) {
    puVar4 = (undefined8 *)(*in_RDI + (long)local_20 * 0xc);
    pvVar3 = pvVar2 + local_20;
    uVar1 = *puVar4;
    pvVar3->field_0 = (anon_union_4_3_4e90b46e_for_vector3_base<int>_1)(int)uVar1;
    pvVar3->field_1 = (anon_union_4_3_4e90b0cd_for_vector3_base<int>_3)(int)((ulong)uVar1 >> 0x20);
    pvVar3->field_2 = *(anon_union_4_4_d826a04f_for_vector3_base<int>_5 *)(puVar4 + 1);
  }
  allocator_default<vector3_base<int>_>::free_array
            ((vector3_base<int> *)CONCAT44(iVar6,in_stack_ffffffffffffffd0));
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    uVar5 = *(undefined4 *)((long)in_RDI + 0xc);
  }
  else {
    uVar5 = (undefined4)in_RDI[1];
  }
  *(undefined4 *)((long)in_RDI + 0xc) = uVar5;
  *in_RDI = (long)pvVar2;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}